

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

UChar32 ucase_fold_63(UChar32 c,uint32_t options)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  if ((uint)c < 0xd800) {
    uVar5 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar5 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar5 = (uint)c >> 5;
    }
  }
  else {
    uVar6 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar6 = 0x2f1c, 0xe07ff < (uint)c)) goto LAB_002913a7;
    uVar5 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar6 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar5] * 4);
LAB_002913a7:
  uVar2 = ucase_props_trieIndex[uVar6];
  if ((uVar2 & 8) == 0) {
    if ((uVar2 & 2) != 0) {
      return c + ((int)(short)uVar2 >> 7);
    }
  }
  else {
    uVar3 = ucase_props_exceptions[uVar2 >> 4];
    if ((short)uVar3 < 0) {
      if ((options & 7) == 0) {
        if (c == 0x49) {
          return 0x69;
        }
        if (c == 0x130) {
          return c;
        }
      }
      else {
        if (c == 0x49) {
          return 0x131;
        }
        if (c == 0x130) {
          return 0x69;
        }
      }
    }
    if ((uVar3 >> 9 & 1) == 0) {
      lVar1 = (ulong)(uVar2 >> 4) * 2;
      lVar8 = lVar1 + 0x2f6c92;
      if (((uVar2 & 2) != 0) && ((uVar3 & 0x10) != 0)) {
        uVar6 = (ulong)""[uVar3 & 0xf];
        if ((uVar3 >> 8 & 1) == 0) {
          uVar5 = (uint)*(ushort *)(lVar8 + uVar6 * 2);
        }
        else {
          uVar5 = CONCAT22(*(undefined2 *)(lVar8 + uVar6 * 4),
                           *(undefined2 *)(lVar1 + 0x2f6c94 + uVar6 * 4));
        }
        uVar7 = -uVar5;
        if ((uVar3 >> 10 & 1) == 0) {
          uVar7 = uVar5;
        }
        return c + uVar7;
      }
      if ((uVar3 & 2) == 0) {
        sVar4 = 0;
        if ((uVar3 & 1) == 0) {
          return c;
        }
      }
      else {
        sVar4 = 1;
      }
      uVar6 = (ulong)""[(uint)uVar3 & ~(-1 << sVar4)];
      if ((uVar3 >> 8 & 1) == 0) {
        return (UChar32)*(ushort *)(lVar8 + uVar6 * 2);
      }
      return CONCAT22(*(undefined2 *)(lVar8 + uVar6 * 4),
                      *(undefined2 *)(lVar1 + 0x2f6c94 + uVar6 * 4));
    }
  }
  return c;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_fold(UChar32 c, uint32_t options) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        int32_t idx;
        if(excWord&UCASE_EXC_CONDITIONAL_FOLD) {
            /* special case folding mappings, hardcoded */
            if((options&_FOLD_CASE_OPTIONS_MASK)==U_FOLD_CASE_DEFAULT) {
                /* default mappings */
                if(c==0x49) {
                    /* 0049; C; 0069; # LATIN CAPITAL LETTER I */
                    return 0x69;
                } else if(c==0x130) {
                    /* no simple case folding for U+0130 */
                    return c;
                }
            } else {
                /* Turkic mappings */
                if(c==0x49) {
                    /* 0049; T; 0131; # LATIN CAPITAL LETTER I */
                    return 0x131;
                } else if(c==0x130) {
                    /* 0130; T; 0069; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    return 0x69;
                }
            }
        }
        if((excWord&UCASE_EXC_NO_SIMPLE_CASE_FOLDING)!=0) {
            return c;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_FOLD)) {
            idx=UCASE_EXC_FOLD;
        } else if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            idx=UCASE_EXC_LOWER;
        } else {
            return c;
        }
        GET_SLOT_VALUE(excWord, idx, pe, c);
    }
    return c;
}